

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

void __thiscall despot::BaseRockSample::PrintState(BaseRockSample *this,State *state,ostream *out)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  int *piVar7;
  ostream *poVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  Coord pos;
  undefined8 local_48;
  Coord local_40 [8];
  Coord local_38 [8];
  
  cVar4 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  if (-2 < this->size_) {
    iVar11 = -1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"# ",2);
      iVar11 = iVar11 + 1;
    } while (iVar11 <= this->size_);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  if (0 < this->size_) {
    iVar11 = this->size_;
    do {
      iVar6 = iVar11 + -1;
      std::__ostream_insert<char,std::char_traits<char>>(out,"# ",2);
      if (0 < this->size_) {
        iVar10 = 0;
        do {
          despot::Coord::Coord(local_38,iVar10,iVar6);
          piVar7 = Grid<int>::operator()(&this->grid_,local_38);
          iVar1 = *piVar7;
          uVar2 = *(uint *)(state + 0xc);
          local_48 = Grid<int>::GetCoord(&this->grid_,(int)uVar2 >> ((byte)this->num_rocks_ & 0x1f))
          ;
          despot::Coord::Coord(local_40,iVar10,iVar6);
          cVar5 = despot::operator==((Coord *)&local_48,local_40);
          poVar8 = out;
          if (cVar5 == '\0') {
            if (iVar1 < 0) {
              lVar9 = 2;
              pcVar12 = ". ";
            }
            else {
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)out,iVar1);
              pcVar12 = "$";
              if ((uVar2 & 1 << ((byte)iVar1 & 0x1f)) == 0) {
                pcVar12 = "X";
              }
              lVar9 = 1;
            }
          }
          else {
            lVar9 = 2;
            pcVar12 = "R ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar12,lVar9);
          iVar10 = iVar10 + 1;
        } while (iVar10 < this->size_);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"#",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      bVar3 = 1 < iVar11;
      iVar11 = iVar6;
    } while (bVar3);
  }
  if (-2 < this->size_) {
    iVar11 = -1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"# ",2);
      iVar11 = iVar11 + 1;
    } while (iVar11 <= this->size_);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  return;
}

Assistant:

void BaseRockSample::PrintState(const State& state, ostream& out) const {
	out << endl;
	for (int x = 0; x < size_ + 2; x++)
		out << "# ";
	out << endl;
	for (int y = size_ - 1; y >= 0; y--) {
		out << "# ";
		for (int x = 0; x < size_; x++) {
			Coord pos(x, y);
			int rock = grid_(pos);
			int status = GetRock(&state, rock);
			if (GetRobPos(&state) == Coord(x, y))
				out << "R ";
			else if (rock >= 0)
				out << rock << (status ? "$" : "X");
			else
				out << ". ";
		}
		out << "#" << endl;
	}
	for (int x = 0; x < size_ + 2; x++)
		out << "# ";
	out << endl;
}